

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::generateLogon(Session *this)

{
  bool bVar1;
  FieldBase *field;
  SEQNUM value;
  Header *header;
  UtcTimeStamp local_390;
  FieldBase local_378;
  BOOLEAN local_319;
  FieldBase local_318;
  UtcTimeStamp local_2c0;
  FieldBase local_2a8;
  FieldBase local_250;
  allocator<char> local_1e1;
  STRING local_1e0;
  MsgType local_1c0;
  undefined1 local_168 [8];
  Message logon;
  Session *this_local;
  
  logon._336_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"A",&local_1e1);
  MsgType::MsgType(&local_1c0,&local_1e0);
  newMessage((Message *)local_168,this,&local_1c0);
  MsgType::~MsgType(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  EncryptMethod::EncryptMethod((EncryptMethod *)&local_250,0);
  FieldMap::setField((FieldMap *)local_168,&local_250,true);
  EncryptMethod::~EncryptMethod((EncryptMethod *)&local_250);
  field = (FieldBase *)SessionState::heartBtInt(&this->m_state);
  FieldMap::setField((FieldMap *)local_168,field,true);
  bVar1 = SessionID::isFIXT(&this->m_sessionID);
  if (bVar1) {
    DefaultApplVerID::DefaultApplVerID
              ((DefaultApplVerID *)&local_2a8,&this->m_senderDefaultApplVerID);
    FieldMap::setField((FieldMap *)local_168,&local_2a8,true);
    DefaultApplVerID::~DefaultApplVerID((DefaultApplVerID *)&local_2a8);
  }
  if ((this->m_refreshOnLogon & 1U) != 0) {
    refresh(this);
  }
  if ((this->m_resetOnLogon & 1U) != 0) {
    std::function<FIX::UtcTimeStamp_()>::operator()(&local_2c0,&this->m_timestamper);
    SessionState::reset(&this->m_state,&local_2c0);
    UtcTimeStamp::~UtcTimeStamp(&local_2c0);
  }
  bVar1 = shouldSendReset(this);
  if (bVar1) {
    local_319 = true;
    ResetSeqNumFlag::ResetSeqNumFlag((ResetSeqNumFlag *)&local_318,&local_319);
    FieldMap::setField((FieldMap *)local_168,&local_318,true);
    ResetSeqNumFlag::~ResetSeqNumFlag((ResetSeqNumFlag *)&local_318);
  }
  if ((this->m_sendNextExpectedMsgSeqNum & 1U) != 0) {
    value = getExpectedTargetNum(this);
    NextExpectedMsgSeqNum::NextExpectedMsgSeqNum((NextExpectedMsgSeqNum *)&local_378,value);
    FieldMap::setField((FieldMap *)local_168,&local_378,true);
    NextExpectedMsgSeqNum::~NextExpectedMsgSeqNum((NextExpectedMsgSeqNum *)&local_378);
  }
  header = Message::getHeader((Message *)local_168);
  fill(this,header);
  std::function<FIX::UtcTimeStamp_()>::operator()(&local_390,&this->m_timestamper);
  SessionState::lastReceivedTime(&this->m_state,&local_390);
  UtcTimeStamp::~UtcTimeStamp(&local_390);
  SessionState::testRequest(&this->m_state,0);
  SessionState::sentLogon(&this->m_state,true);
  sendRaw(this,(Message *)local_168,0);
  Message::~Message((Message *)local_168);
  return;
}

Assistant:

void Session::generateLogon() {
  Message logon = newMessage(MsgType(MsgType_Logon));

  logon.setField(EncryptMethod(0));
  logon.setField(m_state.heartBtInt());
  if (m_sessionID.isFIXT()) {
    logon.setField(DefaultApplVerID(m_senderDefaultApplVerID));
  }
  if (m_refreshOnLogon) {
    refresh();
  }
  if (m_resetOnLogon) {
    m_state.reset(m_timestamper());
  }
  if (shouldSendReset()) {
    logon.setField(ResetSeqNumFlag(true));
  }
  if (m_sendNextExpectedMsgSeqNum) {
    logon.setField(NextExpectedMsgSeqNum(getExpectedTargetNum()));
  }

  fill(logon.getHeader());
  m_state.lastReceivedTime(m_timestamper());
  m_state.testRequest(0);
  m_state.sentLogon(true);
  sendRaw(logon);
}